

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apriltag.c
# Opt level: O1

void apriltag_detector_remove_family(apriltag_detector_t *td,apriltag_family_t *fam)

{
  int iVar1;
  zarray_t *pzVar2;
  size_t __n;
  int iVar3;
  char *__s2;
  long lVar4;
  ulong uVar5;
  apriltag_family_t *local_38;
  
  local_38 = fam;
  quick_decode_uninit(fam);
  pzVar2 = td->tag_families;
  if (pzVar2 == (zarray_t *)0x0) {
    __assert_fail("za != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christianrauch[P]apriltag2/common/zarray.h"
                  ,0x127,"int zarray_remove_value(zarray_t *, const void *, int)");
  }
  iVar1 = pzVar2->size;
  if (0 < (long)iVar1) {
    __n = pzVar2->el_sz;
    __s2 = pzVar2->data;
    lVar4 = 0;
    do {
      iVar3 = bcmp(&local_38,__s2,__n);
      if (iVar3 == 0) {
        uVar5 = (ulong)(iVar1 - 1) - lVar4;
        if (0 < (int)uVar5) {
          memmove(__s2,__s2 + __n,(uVar5 & 0xffffffff) * __n);
        }
        pzVar2->size = pzVar2->size + -1;
        return;
      }
      lVar4 = lVar4 + 1;
      __s2 = __s2 + __n;
    } while (iVar1 != lVar4);
  }
  return;
}

Assistant:

void apriltag_detector_remove_family(apriltag_detector_t *td, apriltag_family_t *fam)
{
    quick_decode_uninit(fam);
    zarray_remove_value(td->tag_families, &fam, 0);
}